

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeString::doLastIndexOf(UnicodeString *this,UChar c,int32_t start,int32_t length)

{
  ushort uVar1;
  UChar *pUVar2;
  int iVar3;
  int count;
  char16_t *pcVar4;
  uint uVar5;
  int32_t iVar6;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  uVar5 = 0xffffffff;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar3 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)(short)uVar1 >> 5;
    }
    iVar6 = start;
    if (iVar3 < start) {
      iVar6 = iVar3;
    }
    if (start < 0) {
      iVar6 = 0;
    }
    count = iVar3 - iVar6;
    if (length <= iVar3 - iVar6) {
      count = length;
    }
    if (length < 0) {
      count = 0;
    }
    if ((uVar1 & 2) == 0) {
      pcVar4 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar4 = (char16_t *)((long)&this->fUnion + 2);
    }
    pUVar2 = u_memrchr_63(pcVar4 + iVar6,c,count);
    uVar5 = -(uint)(pUVar2 == (UChar *)0x0) | (uint)((ulong)((long)pUVar2 - (long)pcVar4) >> 1);
  }
  return uVar5;
}

Assistant:

int32_t
UnicodeString::doLastIndexOf(UChar c,
                 int32_t start,
                 int32_t length) const
{
  if(isBogus()) {
    return -1;
  }

  // pin indices
  pinIndices(start, length);

  // find the last occurrence of c
  const UChar *array = getArrayStart();
  const UChar *match = u_memrchr(array + start, c, length);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}